

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::AdagradTrainer::update(AdagradTrainer *this,real scale)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  pointer pSVar5;
  Parameters *pPVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  pointer pTVar11;
  long lVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  pointer pSVar16;
  pointer pSVar17;
  Model *pMVar18;
  _Hash_node_base *p_Var19;
  uint i_2;
  ulong uVar20;
  pointer pSVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  uint uVar26;
  Index size;
  uint p_2;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  Index index_3;
  uint p_1;
  int iVar30;
  uint uVar31;
  Index index_7;
  uint p;
  Index index_1;
  ulong uVar32;
  Index size_2;
  Index index;
  long lVar33;
  ulong uVar34;
  pointer ppPVar35;
  uint i;
  ulong uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar53;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar54;
  float fVar57;
  float fVar58;
  undefined1 in_XMM11 [16];
  undefined1 auVar55 [16];
  float fVar59;
  undefined1 auVar56 [16];
  float fVar60;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_a8;
  pointer local_88;
  pointer local_80;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_68;
  undefined1 local_48 [16];
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    pSVar5 = (this->vp).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pSVar16 = (this->vp).
              super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar16,0);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar16 >> 0x20);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar5,0);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar5 >> 0x20);
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_a8);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    pSVar21 = (this->vlp).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (this->vlp).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_68.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar17,0);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar21,0);
    local_a8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar21 >> 0x20);
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_a8);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    this->shadow_params_allocated = true;
  }
  fVar37 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar18 = (this->super_Trainer).model;
  ppPVar35 = (pMVar18->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_80 = (pMVar18->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppPVar35 != local_80) {
    uVar34 = 0;
    local_88 = (pointer)CONCAT44(local_88._4_4_,fVar37 * scale);
    fVar60 = fVar37 * scale;
    do {
      pPVar6 = *ppPVar35;
      uVar22 = (ulong)(pPVar6->values).d.nd;
      iVar30 = 1;
      iVar28 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar28 = iVar28 * (pPVar6->values).d.d[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      uVar22 = (ulong)(pPVar6->g).d.nd;
      if (uVar22 != 0) {
        iVar30 = 1;
        uVar20 = 0;
        do {
          iVar30 = iVar30 * (pPVar6->g).d.d[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      pSVar5 = (this->vp).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar22 = (ulong)pSVar5[uVar34].h.d.nd;
      iVar25 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar25 = iVar25 * *(int *)((long)pSVar5[uVar34].h.d.d + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      pfVar7 = (pPVar6->values).v;
      uVar29 = iVar28 * (pPVar6->values).d.bd;
      fVar39 = (this->super_Trainer).lambda;
      pfVar8 = (pPVar6->g).v;
      uVar31 = iVar30 * (pPVar6->g).d.bd;
      pfVar9 = pSVar5[uVar34].h.v;
      uVar26 = iVar25 * pSVar5[uVar34].h.d.bd;
      uVar22 = (ulong)uVar26;
      local_a8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_a8.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar60);
      local_a8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar8,0);
      local_a8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pfVar8 >> 0x20);
      local_68.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_68.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar60);
      local_68.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ =
           local_a8.
           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish._4_4_;
      local_68.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           local_a8.
           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
      if (uVar26 != uVar31) goto LAB_002115f9;
      uVar20 = uVar22;
      if ((((ulong)pfVar9 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar20)) {
        uVar20 = uVar22;
      }
      uVar27 = uVar22 - uVar20;
      uVar32 = uVar27 + 3;
      if (-1 < (long)uVar27) {
        uVar32 = uVar27;
      }
      if (uVar20 != 0) {
        uVar36 = 0;
        do {
          pfVar9[uVar36] = pfVar8[uVar36] * fVar60 * pfVar8[uVar36] * fVar60 + pfVar9[uVar36];
          uVar36 = uVar36 + 1;
        } while (uVar20 != uVar36);
      }
      uVar32 = (uVar32 & 0xfffffffffffffffc) + uVar20;
      if (3 < (long)uVar27) {
        do {
          pfVar10 = pfVar8 + uVar20;
          fVar40 = pfVar10[1];
          fVar38 = pfVar10[2];
          fVar54 = pfVar10[3];
          pfVar1 = pfVar9 + uVar20;
          fVar57 = pfVar1[1];
          fVar58 = pfVar1[2];
          fVar59 = pfVar1[3];
          pfVar2 = pfVar9 + uVar20;
          *pfVar2 = *pfVar10 * fVar60 * fVar60 * *pfVar10 + *pfVar1;
          pfVar2[1] = fVar40 * fVar60 * fVar60 * fVar40 + fVar57;
          pfVar2[2] = fVar38 * fVar60 * fVar60 * fVar38 + fVar58;
          pfVar2[3] = fVar54 * fVar60 * fVar60 * fVar54 + fVar59;
          uVar20 = uVar20 + 4;
        } while ((long)uVar20 < (long)uVar32);
      }
      if ((long)uVar32 < (long)uVar22) {
        do {
          pfVar9[uVar32] = pfVar8[uVar32] * fVar60 * pfVar8[uVar32] * fVar60 + pfVar9[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar22 != uVar32);
      }
      pfVar9 = pSVar5[uVar34].h.v;
      uVar22 = (ulong)pSVar5[uVar34].h.d.nd;
      iVar28 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar28 = iVar28 * *(int *)((long)pSVar5[uVar34].h.d.d + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      if (uVar31 != iVar28 * pSVar5[uVar34].h.d.bd) goto LAB_002115e2;
      if (uVar31 != uVar29) goto LAB_00211618;
      uVar22 = (ulong)(pPVar6->values).d.nd;
      iVar28 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar28 = iVar28 * (pPVar6->values).d.d[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      fVar40 = this->epsilon;
      uVar26 = iVar28 * (pPVar6->values).d.bd;
      uVar22 = (ulong)uVar26;
      pfVar10 = (pPVar6->values).v;
      local_a8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_a8.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar60);
      if (uVar26 != uVar29) goto LAB_002115cb;
      uVar20 = uVar22;
      if ((((ulong)pfVar10 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar20)) {
        uVar20 = uVar22;
      }
      fVar38 = -(this->super_Trainer).eta;
      uVar27 = uVar22 - uVar20;
      uVar32 = uVar27 + 3;
      if (-1 < (long)uVar27) {
        uVar32 = uVar27;
      }
      if (uVar20 != 0) {
        uVar36 = 0;
        do {
          pfVar10[uVar36] =
               (((pfVar8[uVar36] * fVar60) / SQRT(pfVar9[uVar36] + fVar40)) * fVar38 -
               pfVar7[uVar36] * fVar39) + pfVar10[uVar36];
          uVar36 = uVar36 + 1;
        } while (uVar20 != uVar36);
      }
      local_78 = CONCAT44(0x80000000,fVar38);
      uStack_70 = 0x80000000;
      uStack_6c = 0x80000000;
      local_48 = ZEXT416((uint)fVar39);
      uVar32 = (uVar32 & 0xfffffffffffffffc) + uVar20;
      if (3 < (long)uVar27) {
        do {
          pfVar1 = pfVar9 + uVar20;
          auVar49._0_4_ = *pfVar1 + fVar40;
          auVar49._4_4_ = pfVar1[1] + fVar40;
          auVar49._8_4_ = pfVar1[2] + fVar40;
          auVar49._12_4_ = pfVar1[3] + fVar40;
          auVar43._0_4_ = -(uint)((int)auVar49._0_4_ < 0);
          auVar43._4_4_ = -(uint)((int)auVar49._4_4_ < 0);
          auVar43._8_4_ = -(uint)((int)auVar49._8_4_ < 0);
          auVar43._12_4_ = -(uint)((int)auVar49._12_4_ < 0);
          auVar55 = rsqrtps(in_XMM11,auVar49);
          fVar54 = auVar55._0_4_;
          fVar57 = auVar55._4_4_;
          fVar58 = auVar55._8_4_;
          fVar59 = auVar55._12_4_;
          auVar55 = auVar49 & _DAT_0021ead0;
          iVar28 = auVar55._0_4_;
          iVar30 = auVar55._4_4_;
          iVar25 = auVar55._8_4_;
          iVar53 = auVar55._12_4_;
          auVar51._0_4_ = -(uint)(-0x7f800002 < (int)(iVar28 - 1U ^ 0x80000000));
          auVar51._4_4_ = -(uint)(-0x7f800002 < (int)(iVar30 - 1U ^ 0x80000000));
          auVar51._8_4_ = -(uint)(-0x7f800002 < (int)(iVar25 - 1U ^ 0x80000000));
          auVar51._12_4_ = -(uint)(-0x7f800002 < (int)(iVar53 - 1U ^ 0x80000000));
          auVar41._0_4_ = -(uint)(iVar28 == 0x7f800000);
          auVar41._4_4_ = -(uint)(iVar30 == 0x7f800000);
          auVar41._8_4_ = -(uint)(iVar25 == 0x7f800000);
          auVar41._12_4_ = -(uint)(iVar53 == 0x7f800000);
          in_XMM11._0_4_ = -(uint)(0x7f800000 < iVar28);
          in_XMM11._4_4_ = -(uint)(0x7f800000 < iVar30);
          in_XMM11._8_4_ = -(uint)(0x7f800000 < iVar25);
          in_XMM11._12_4_ = -(uint)(0x7f800000 < iVar53);
          in_XMM11 = in_XMM11 | auVar41;
          auVar42._0_4_ = -(uint)((int)(iVar28 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar42._4_4_ = -(uint)((int)(iVar30 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar42._8_4_ = -(uint)((int)(iVar25 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar42._12_4_ = -(uint)((int)(iVar53 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar43 = auVar42 | in_XMM11 | ~auVar51 & auVar43;
          pfVar1 = pfVar8 + uVar20;
          auVar44._0_4_ = *pfVar1 * fVar60;
          auVar44._4_4_ = pfVar1[1] * fVar60;
          auVar44._8_4_ = pfVar1[2] * fVar60;
          auVar44._12_4_ = pfVar1[3] * fVar60;
          auVar55._4_4_ =
               (uint)((fVar57 * fVar57 * auVar49._4_4_ * -0.5 + 1.5) * fVar57 * auVar49._4_4_) &
               auVar43._4_4_;
          auVar55._0_4_ =
               (uint)((fVar54 * fVar54 * auVar49._0_4_ * -0.5 + 1.5) * fVar54 * auVar49._0_4_) &
               auVar43._0_4_;
          auVar55._8_4_ =
               (uint)((fVar58 * fVar58 * auVar49._8_4_ * -0.5 + 1.5) * fVar58 * auVar49._8_4_) &
               auVar43._8_4_;
          auVar55._12_4_ =
               (uint)((fVar59 * fVar59 * auVar49._12_4_ * -0.5 + 1.5) * fVar59 * auVar49._12_4_) &
               auVar43._12_4_;
          auVar55 = divps(auVar44,auVar55);
          pfVar1 = pfVar7 + uVar20;
          fVar54 = pfVar1[1];
          fVar57 = pfVar1[2];
          fVar58 = pfVar1[3];
          pfVar2 = pfVar10 + uVar20;
          fVar59 = pfVar2[1];
          fVar14 = pfVar2[2];
          fVar15 = pfVar2[3];
          pfVar3 = pfVar10 + uVar20;
          *pfVar3 = (auVar55._0_4_ * fVar38 - *pfVar1 * fVar39) + *pfVar2;
          pfVar3[1] = (auVar55._4_4_ * fVar38 - fVar54 * fVar39) + fVar59;
          pfVar3[2] = (auVar55._8_4_ * fVar38 - fVar57 * fVar39) + fVar14;
          pfVar3[3] = (auVar55._12_4_ * fVar38 - fVar58 * fVar39) + fVar15;
          uVar20 = uVar20 + 4;
        } while ((long)uVar20 < (long)uVar32);
      }
      if ((long)uVar32 < (long)uVar22) {
        do {
          pfVar10[uVar32] =
               (((pfVar8[uVar32] * fVar60) / SQRT(pfVar9[uVar32] + fVar40)) * fVar38 -
               pfVar7[uVar32] * fVar39) + pfVar10[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar22 != uVar32);
      }
      uVar34 = (ulong)((int)uVar34 + 1);
      Parameters::clear(pPVar6);
      ppPVar35 = ppPVar35 + 1;
      fVar60 = local_88._0_4_;
    } while (ppPVar35 != local_80);
    pMVar18 = (this->super_Trainer).model;
  }
  local_80 = (pointer)(pMVar18->lookup_params).
                      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (pointer)(pMVar18->lookup_params).
                      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if (local_80 != local_88) {
    fVar37 = fVar37 * scale;
    local_78 = 0;
    do {
      pPVar6 = *local_80;
      p_Var19 = (((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&(pPVar6->values).bs)->_M_h)._M_before_begin._M_nxt;
      if (p_Var19 != (_Hash_node_base *)0x0) {
        pSVar21 = (this->vlp).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start + (local_78 & 0xffffffff);
        local_48._0_8_ = pSVar21;
        do {
          uVar34 = (ulong)*(uint *)&p_Var19[1]._M_nxt;
          pTVar11 = (((_Vector_impl *)(pPVar6->values).d.d)->super__Vector_impl_data)._M_start;
          uVar22 = (ulong)pTVar11[uVar34].d.nd;
          iVar30 = 1;
          iVar28 = 1;
          if (uVar22 != 0) {
            uVar20 = 0;
            do {
              iVar28 = iVar28 * pTVar11[uVar34].d.d[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          lVar12 = *(long *)((_Vector_impl *)(pPVar6->values).d.d + 1);
          lVar4 = lVar12 + uVar34 * 0x48;
          if ((ulong)*(uint *)(lVar4 + 0x1c) != 0) {
            iVar30 = 1;
            uVar22 = 0;
            do {
              iVar30 = iVar30 * *(int *)(lVar4 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (*(uint *)(lVar4 + 0x1c) != uVar22);
          }
          lVar33 = *(long *)&(pSVar21->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar34 * 0x48;
          iVar25 = 1;
          if ((ulong)*(uint *)(lVar33 + 0x1c) != 0) {
            uVar22 = 0;
            do {
              iVar25 = iVar25 * *(int *)(lVar33 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (*(uint *)(lVar33 + 0x1c) != uVar22);
          }
          pfVar7 = pTVar11[uVar34].v;
          uVar26 = iVar28 * pTVar11[uVar34].d.bd;
          fVar60 = (this->super_Trainer).lambda;
          lVar12 = *(long *)(lVar12 + 0x28 + uVar34 * 0x48);
          uVar29 = iVar30 * *(int *)(lVar4 + 0x20);
          uVar22 = *(ulong *)(lVar33 + 0x28);
          uVar31 = iVar25 * *(int *)(lVar33 + 0x20);
          uVar20 = (ulong)uVar31;
          local_a8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_a8.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar37);
          local_a8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)lVar12;
          local_a8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (undefined4)((ulong)lVar12 >> 0x20);
          local_68.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_68.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar37);
          local_68.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
               local_a8.
               super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
               ._M_impl.super__Vector_impl_data._M_finish._4_4_;
          local_68.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               local_a8.
               super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
          if (uVar31 != uVar29) goto LAB_002115f9;
          uVar32 = uVar20;
          if (((uVar22 & 3) == 0) &&
             (uVar32 = (ulong)(-((uint)(uVar22 >> 2) & 0x3fffffff) & 3), uVar20 <= uVar32)) {
            uVar32 = uVar20;
          }
          uVar36 = uVar20 - uVar32;
          uVar27 = uVar36 + 3;
          if (-1 < (long)uVar36) {
            uVar27 = uVar36;
          }
          if (uVar32 != 0) {
            uVar23 = 0;
            do {
              fVar39 = *(float *)(lVar12 + uVar23 * 4) * fVar37;
              *(float *)(uVar22 + uVar23 * 4) = fVar39 * fVar39 + *(float *)(uVar22 + uVar23 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar32 != uVar23);
          }
          uVar27 = (uVar27 & 0xfffffffffffffffc) + uVar32;
          if (3 < (long)uVar36) {
            do {
              pfVar8 = (float *)(lVar12 + uVar32 * 4);
              fVar39 = pfVar8[1];
              fVar40 = pfVar8[2];
              fVar38 = pfVar8[3];
              pfVar9 = (float *)(uVar22 + uVar32 * 4);
              fVar54 = pfVar9[1];
              fVar57 = pfVar9[2];
              fVar58 = pfVar9[3];
              pfVar10 = (float *)(uVar22 + uVar32 * 4);
              *pfVar10 = *pfVar8 * fVar37 * fVar37 * *pfVar8 + *pfVar9;
              pfVar10[1] = fVar39 * fVar37 * fVar37 * fVar39 + fVar54;
              pfVar10[2] = fVar40 * fVar37 * fVar37 * fVar40 + fVar57;
              pfVar10[3] = fVar38 * fVar37 * fVar37 * fVar38 + fVar58;
              uVar32 = uVar32 + 4;
            } while ((long)uVar32 < (long)uVar27);
          }
          if ((long)uVar27 < (long)uVar20) {
            do {
              fVar39 = *(float *)(lVar12 + uVar27 * 4) * fVar37;
              *(float *)(uVar22 + uVar27 * 4) = fVar39 * fVar39 + *(float *)(uVar22 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar20 != uVar27);
          }
          lVar4 = *(long *)(lVar33 + 0x28);
          iVar28 = 1;
          if ((ulong)*(uint *)(lVar33 + 0x1c) != 0) {
            uVar22 = 0;
            do {
              iVar28 = iVar28 * *(int *)(lVar33 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (*(uint *)(lVar33 + 0x1c) != uVar22);
          }
          if (uVar29 != iVar28 * *(int *)(lVar33 + 0x20)) goto LAB_002115e2;
          if (uVar29 != uVar26) goto LAB_00211618;
          pTVar11 = (((_Vector_impl *)(pPVar6->values).d.d)->super__Vector_impl_data)._M_start;
          uVar22 = (ulong)pTVar11[uVar34].d.nd;
          iVar28 = 1;
          if (uVar22 != 0) {
            uVar20 = 0;
            do {
              iVar28 = iVar28 * pTVar11[uVar34].d.d[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          fVar39 = this->epsilon;
          uVar29 = iVar28 * pTVar11[uVar34].d.bd;
          uVar22 = (ulong)uVar29;
          pfVar8 = pTVar11[uVar34].v;
          local_a8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_a8.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar37);
          if (uVar29 != uVar26) goto LAB_002115cb;
          uVar34 = uVar22;
          if ((((ulong)pfVar8 & 3) == 0) &&
             (uVar34 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar34)) {
            uVar34 = uVar22;
          }
          fVar40 = -(this->super_Trainer).eta;
          uVar32 = uVar22 - uVar34;
          uVar20 = uVar32 + 3;
          if (-1 < (long)uVar32) {
            uVar20 = uVar32;
          }
          if (uVar34 != 0) {
            uVar27 = 0;
            do {
              pfVar8[uVar27] =
                   (((*(float *)(lVar12 + uVar27 * 4) * fVar37) /
                    SQRT(*(float *)(lVar4 + uVar27 * 4) + fVar39)) * fVar40 -
                   pfVar7[uVar27] * fVar60) + pfVar8[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar34 != uVar27);
          }
          uVar20 = (uVar20 & 0xfffffffffffffffc) + uVar34;
          if (3 < (long)uVar32) {
            do {
              pfVar9 = (float *)(lVar4 + uVar34 * 4);
              auVar50._0_4_ = *pfVar9 + fVar39;
              auVar50._4_4_ = pfVar9[1] + fVar39;
              auVar50._8_4_ = pfVar9[2] + fVar39;
              auVar50._12_4_ = pfVar9[3] + fVar39;
              auVar45._0_4_ = -(uint)((int)auVar50._0_4_ < 0);
              auVar45._4_4_ = -(uint)((int)auVar50._4_4_ < 0);
              auVar45._8_4_ = -(uint)((int)auVar50._8_4_ < 0);
              auVar45._12_4_ = -(uint)((int)auVar50._12_4_ < 0);
              auVar55 = rsqrtps(in_XMM11,auVar50);
              fVar38 = auVar55._0_4_;
              fVar54 = auVar55._4_4_;
              fVar57 = auVar55._8_4_;
              fVar58 = auVar55._12_4_;
              auVar55 = auVar50 & _DAT_0021ead0;
              iVar28 = auVar55._0_4_;
              iVar30 = auVar55._4_4_;
              iVar25 = auVar55._8_4_;
              iVar53 = auVar55._12_4_;
              auVar52._0_4_ = -(uint)(-0x7f800002 < (int)(iVar28 - 1U ^ 0x80000000));
              auVar52._4_4_ = -(uint)(-0x7f800002 < (int)(iVar30 - 1U ^ 0x80000000));
              auVar52._8_4_ = -(uint)(-0x7f800002 < (int)(iVar25 - 1U ^ 0x80000000));
              auVar52._12_4_ = -(uint)(-0x7f800002 < (int)(iVar53 - 1U ^ 0x80000000));
              auVar46._0_4_ = -(uint)(iVar28 == 0x7f800000);
              auVar46._4_4_ = -(uint)(iVar30 == 0x7f800000);
              auVar46._8_4_ = -(uint)(iVar25 == 0x7f800000);
              auVar46._12_4_ = -(uint)(iVar53 == 0x7f800000);
              auVar56._0_4_ = -(uint)(0x7f800000 < iVar28);
              auVar56._4_4_ = -(uint)(0x7f800000 < iVar30);
              auVar56._8_4_ = -(uint)(0x7f800000 < iVar25);
              auVar56._12_4_ = -(uint)(0x7f800000 < iVar53);
              in_XMM11 = auVar56 | auVar46;
              auVar47._0_4_ = -(uint)((int)(iVar28 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar47._4_4_ = -(uint)((int)(iVar30 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar47._8_4_ = -(uint)((int)(iVar25 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar47._12_4_ = -(uint)((int)(iVar53 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar55 = auVar47 | in_XMM11 | ~auVar52 & auVar45;
              pfVar9 = (float *)(lVar12 + uVar34 * 4);
              auVar48._0_4_ = *pfVar9 * fVar37;
              auVar48._4_4_ = pfVar9[1] * fVar37;
              auVar48._8_4_ = pfVar9[2] * fVar37;
              auVar48._12_4_ = pfVar9[3] * fVar37;
              auVar13._4_4_ =
                   (uint)((fVar54 * fVar54 * auVar50._4_4_ * -0.5 + 1.5) * fVar54 * auVar50._4_4_) &
                   auVar55._4_4_;
              auVar13._0_4_ =
                   (uint)((fVar38 * fVar38 * auVar50._0_4_ * -0.5 + 1.5) * fVar38 * auVar50._0_4_) &
                   auVar55._0_4_;
              auVar13._8_4_ =
                   (uint)((fVar57 * fVar57 * auVar50._8_4_ * -0.5 + 1.5) * fVar57 * auVar50._8_4_) &
                   auVar55._8_4_;
              auVar13._12_4_ =
                   (uint)((fVar58 * fVar58 * auVar50._12_4_ * -0.5 + 1.5) * fVar58 * auVar50._12_4_)
                   & auVar55._12_4_;
              auVar55 = divps(auVar48,auVar13);
              pfVar9 = pfVar7 + uVar34;
              fVar38 = pfVar9[1];
              fVar54 = pfVar9[2];
              fVar57 = pfVar9[3];
              pfVar10 = pfVar8 + uVar34;
              fVar58 = pfVar10[1];
              fVar59 = pfVar10[2];
              fVar14 = pfVar10[3];
              pfVar1 = pfVar8 + uVar34;
              *pfVar1 = (auVar55._0_4_ * fVar40 - *pfVar9 * fVar60) + *pfVar10;
              pfVar1[1] = (auVar55._4_4_ * fVar40 - fVar38 * fVar60) + fVar58;
              pfVar1[2] = (auVar55._8_4_ * fVar40 - fVar54 * fVar60) + fVar59;
              pfVar1[3] = (auVar55._12_4_ * fVar40 - fVar57 * fVar60) + fVar14;
              uVar34 = uVar34 + 4;
            } while ((long)uVar34 < (long)uVar20);
          }
          if ((long)uVar20 < (long)uVar22) {
            do {
              pfVar8[uVar20] =
                   (((*(float *)(lVar12 + uVar20 * 4) * fVar37) /
                    SQRT(*(float *)(lVar4 + uVar20 * 4) + fVar39)) * fVar40 -
                   pfVar7[uVar20] * fVar60) + pfVar8[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          p_Var19 = p_Var19->_M_nxt;
        } while (p_Var19 != (_Hash_node_base *)0x0);
      }
      local_78 = (ulong)((int)local_78 + 1);
      LookupParameters::clear((LookupParameters *)pPVar6);
      local_80 = local_80 + 1;
    } while (local_80 != local_88);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_002115f9:
  pcVar24 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
  goto LAB_0021160e;
LAB_002115e2:
  pcVar24 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_0021162d;
LAB_00211618:
  pcVar24 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs ..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0021162d:
  local_a8.
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       local_68.
       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_a8.
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       local_68.
       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar24);
LAB_002115cb:
  pcVar24 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
LAB_0021160e:
  local_a8.
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       local_68.
       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_a8.
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       local_68.
       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar24);
}

Assistant:

void AdagradTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  pi = 0;
  const float gscale = clip_gradients();
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    auto g = scale * gscale * p->g.vec();
    auto g2 = g.cwiseProduct(g);
    v.vec() += g2;
    auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
    p->values.vec() += delta - reg;
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = p->values[i].vec() * lambda;
      auto g = scale * gscale * p->grads[i].vec();
      auto g2 = g.cwiseProduct(g);
      v.vec() += g2;
      auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
  }

  ++updates;
}